

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tck-syntax.cc
# Opt level: O3

int parse_command_line(int argc,char **argv)

{
  size_type sVar1;
  size_type sVar2;
  char *pcVar3;
  int iVar4;
  undefined8 in_RAX;
  invalid_argument *this;
  char *pcVar5;
  code *pcVar6;
  undefined *puVar7;
  string *psVar8;
  int long_option_index;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
LAB_0011ab54:
  while( true ) {
    uStack_38 = CONCAT44(0xffffffff,(undefined4)uStack_38);
    iVar4 = getopt_long(argc,argv,"cd:hn:o:ptj",long_options,(long)&uStack_38 + 4);
    pcVar3 = _optarg;
    sVar2 = output_file_abi_cxx11_._M_string_length;
    sVar1 = process_name_abi_cxx11_._M_string_length;
    pcVar5 = (char *)delimiter_abi_cxx11_._M_string_length;
    if (0x3e < iVar4) break;
    if (iVar4 != 0) {
      if (iVar4 == -1) {
        return _optind;
      }
      if (iVar4 == 0x3a) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)this,"Missing option parameter");
        goto LAB_0011ad57;
      }
switchD_0011ab87_caseD_65:
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)this,"This should never be executed");
LAB_0011ad57:
      puVar7 = &std::runtime_error::typeinfo;
      pcVar6 = std::runtime_error::~runtime_error;
LAB_0011ad91:
      __cxa_throw(this,puVar7,pcVar6);
    }
    iVar4 = strcmp(long_options[uStack_38._4_4_].name,"asynchronous-events");
    if (iVar4 != 0) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)this,"This also should never be executed");
      goto LAB_0011ad57;
    }
    report_asynchronous_events = 1;
  }
  switch(iVar4) {
  case 99:
    check_syntax = 1;
    goto LAB_0011ab54;
  case 100:
    strlen(_optarg);
    psVar8 = &delimiter_abi_cxx11_;
    break;
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x73:
    goto switchD_0011ab87_caseD_65;
  case 0x68:
    help = 1;
    goto LAB_0011ab54;
  case 0x6a:
    json = 1;
    goto LAB_0011ab54;
  case 0x6e:
    strlen(_optarg);
    psVar8 = &process_name_abi_cxx11_;
    pcVar5 = (char *)sVar1;
    break;
  case 0x6f:
    if (*_optarg == '\0') {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Invalid empty output file name");
      puVar7 = &std::invalid_argument::typeinfo;
      pcVar6 = std::invalid_argument::~invalid_argument;
      goto LAB_0011ad91;
    }
    strlen(_optarg);
    std::__cxx11::string::_M_replace(0x1e8a50,0,(char *)sVar2,(ulong)pcVar3);
    goto LAB_0011ab54;
  case 0x70:
    synchronized_product = 1;
    goto LAB_0011ab54;
  case 0x74:
    goto switchD_0011ab87_caseD_74;
  default:
    if (iVar4 == 0x3f) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)this,"Unknown command-line option");
      goto LAB_0011ad57;
    }
    goto switchD_0011ab87_caseD_65;
  }
  std::__cxx11::string::_M_replace((ulong)psVar8,0,pcVar5,(ulong)pcVar3);
  goto LAB_0011ab54;
switchD_0011ab87_caseD_74:
  transform = 1;
  goto LAB_0011ab54;
}

Assistant:

int parse_command_line(int argc, char * argv[])
{
  while (true) {
    int long_option_index = -1;
    int c = getopt_long(argc, argv, options, long_options, &long_option_index);

    if (c == -1)
      break;

    if (c == ':')
      throw std::runtime_error("Missing option parameter");
    else if (c == '?')
      throw std::runtime_error("Unknown command-line option");
    else if (c != 0) {
      switch (c) {
      case 'c':
        check_syntax = true;
        break;
      case 'd':
        delimiter = optarg;
        break;
      case 'h':
        help = true;
        break;
      case 'n':
        process_name = optarg;
        break;
      case 'o':
        if (strcmp(optarg, "") == 0)
          throw std::invalid_argument("Invalid empty output file name");
        output_file = optarg;
        break;
      case 'p':
        synchronized_product = true;
        break;
      case 't':
        transform = true;
        break;
      case 'j':
        json = true;
        break;
      default:
        throw std::runtime_error("This should never be executed");
        break;
      }
    }
    else {
      if (strcmp(long_options[long_option_index].name, "asynchronous-events") == 0)
        report_asynchronous_events = true;
      else
        throw std::runtime_error("This also should never be executed");
    }
  }

  return optind;
}